

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O0

void inproc_pipe_close(void *arg)

{
  long lVar1;
  inproc_queue *queue_00;
  inproc_queue *queue;
  int i;
  inproc_pair *pair;
  inproc_pipe *pipe;
  void *arg_local;
  
  lVar1 = *(long *)((long)arg + 8);
  for (queue._4_4_ = 0; queue._4_4_ < 2; queue._4_4_ = queue._4_4_ + 1) {
    queue_00 = (inproc_queue *)(lVar1 + 0x18 + (long)queue._4_4_ * 0x60);
    nni_mtx_lock(&queue_00->lock);
    queue_00->closed = true;
    inproc_queue_run_closed(queue_00);
    nni_mtx_unlock(&queue_00->lock);
  }
  return;
}

Assistant:

static void
inproc_pipe_close(void *arg)
{
	inproc_pipe *pipe = arg;
	inproc_pair *pair = pipe->pair;

	for (int i = 0; i < 2; i++) {
		inproc_queue *queue = &pair->queues[i];
		nni_mtx_lock(&queue->lock);
		queue->closed = true;
		inproc_queue_run_closed(queue);
		nni_mtx_unlock(&queue->lock);
	}
}